

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O2

void unload_all(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 8;
  for (lVar3 = 0; lVar3 < libCount; lVar3 = lVar3 + 1) {
    dlclose(*(undefined8 *)((long)&libraries->name + lVar2));
    lVar1 = dlerror();
    if (lVar1 != 0) {
      printf("\x1b[33m\n[Warning] %s\x1b[0m",lVar1);
    }
    lVar2 = lVar2 + 0x10;
  }
  free(libraries);
  libCount = 0;
  libraries = (Library *)0x0;
  return;
}

Assistant:

void unload_all(){
    int i = 0;
    char *err = NULL;
    while(i < libCount){
        dlclose(libraries[i].handle);
        if((err = dlerror()) != NULL)
            printf(warning("%s"), err);
        i++;
    }
    memfree(libraries);
    libCount = 0;
    libraries = NULL;
}